

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O0

ostream * test_detail::print_tuple_impl<std::tuple<int,std::__cxx11::string,int>,0ul,1ul,2ul>
                    (ostream *stream,size_type t)

{
  __tuple_element_t<0UL,_tuple<int,_basic_string<char>,_int>_> *p_Var1;
  ostream *poVar2;
  __tuple_element_t<1UL,_tuple<int,_basic_string<char>,_int>_> *p_Var3;
  __tuple_element_t<2UL,_tuple<int,_basic_string<char>,_int>_> *p_Var4;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 *local_30;
  initializer_list<int> x;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *t_local;
  ostream *stream_local;
  
  x._M_len = t;
  std::operator<<(stream,"(");
  p_Var1 = std::get<0ul,int,std::__cxx11::string,int>
                     ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       *)x._M_len);
  std::ostream::operator<<(stream,*p_Var1);
  poVar2 = std::operator<<(stream,", ");
  p_Var3 = std::get<1ul,int,std::__cxx11::string,int>
                     ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       *)x._M_len);
  std::operator<<(poVar2,(string *)p_Var3);
  local_38 = 0;
  poVar2 = std::operator<<(stream,", ");
  p_Var4 = std::get<2ul,int,std::__cxx11::string,int>
                     ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       *)x._M_len);
  std::ostream::operator<<(poVar2,*p_Var4);
  local_34 = 0;
  local_30 = &local_38;
  x._M_array = (iterator)0x2;
  std::operator<<(stream,")");
  return stream;
}

Assistant:

std::ostream & print_tuple_impl (std::ostream & stream, const Tuple & t, std::index_sequence<Head, Tail...>)
    {
        stream << "(";
        stream << std::get<Head>(t);
        auto x = {(stream << ", " << std::get<Tail>(t), 0)...};
        static_cast<void>(x);
        stream << ")";

        return stream;
    }